

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O2

void Fxu_UpdateAddNewDoubles(Fxu_Matrix *p,Fxu_Cube *pCube)

{
  Fxu_Cube *pCube1;
  Fxu_Var *pFVar1;
  Fxu_Cube **ppFVar2;
  
  if (pCube->pOrder != (Fxu_Cube *)0x0) {
    pFVar1 = pCube->pVar;
    if (pFVar1->ppPairs != (Fxu_Pair ***)0x0) {
      ppFVar2 = &pCube->pFirst;
      while (pCube1 = *ppFVar2, pCube1->pVar == pFVar1) {
        if (((pCube1->lLits).nItems != 0) &&
           ((pCube1->pOrder == (Fxu_Cube *)0x0 || (pCube1->iCube < pCube->iCube)))) {
          Fxu_MatrixAddDivisor(p,pCube1,pCube);
          pFVar1 = pCube->pVar;
        }
        ppFVar2 = &pCube1->pNext;
      }
    }
    return;
  }
  __assert_fail("pCube->pOrder",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuUpdate.c"
                ,0x2d7,"void Fxu_UpdateAddNewDoubles(Fxu_Matrix *, Fxu_Cube *)");
}

Assistant:

void Fxu_UpdateAddNewDoubles( Fxu_Matrix * p, Fxu_Cube * pCube )
{
	Fxu_Cube * pTemp;
    assert( pCube->pOrder );

    // if the cube is a recently introduced one
    // it does not have pairs allocated
    // in this case, there is nothing to update
    if ( pCube->pVar->ppPairs == NULL )
        return;

	for ( pTemp = pCube->pFirst; pTemp->pVar == pCube->pVar; pTemp = pTemp->pNext )
    {
        // do not add pairs with the empty cubes
		if ( pTemp->lLits.nItems == 0 )
            continue;
        // to prevent adding duplicated pairs of the new cubes
        // do not add the pair, if the current cube is marked 
        if ( pTemp->pOrder && pTemp->iCube >= pCube->iCube )
            continue;
		Fxu_MatrixAddDivisor( p, pTemp, pCube );
    }
}